

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int n,int *i,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *v)

{
  type_conflict5 tVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar2;
  long lVar3;
  double local_38;
  
  if (0 < n) {
    this_00 = this->m_elem + this->memused;
    iVar2 = 0;
    for (lVar3 = 0; n != (int)lVar3; lVar3 = lVar3 + 1) {
      local_38 = 0.0;
      tVar1 = boost::multiprecision::operator!=(v,&local_38);
      if (tVar1) {
        this_00->idx = i[lVar3];
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)this_00,&v->m_backend);
        this_00 = this_00 + 1;
        iVar2 = iVar2 + 1;
      }
      v = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)(&v->m_backend + 1);
    }
    this->memused = this->memused + iVar2;
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }